

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

void Abc_TgResetGroup(Abc_TgMan_t *pMan)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  char local_38 [3];
  char t;
  int nGVars;
  char pPermNew [16];
  char *pPerm;
  int j;
  int i;
  Abc_TgMan_t *pMan_local;
  
  iVar2 = pMan->nGVars;
  for (pPerm._4_4_ = 1; pPerm._4_4_ < iVar2; pPerm._4_4_ = pPerm._4_4_ + 1) {
    cVar1 = pMan->pPerm[pPerm._4_4_];
    pPerm._0_4_ = pPerm._4_4_;
    while( true ) {
      bVar3 = false;
      if (0 < (int)pPerm) {
        bVar3 = cVar1 < pMan->pPerm[(int)pPerm + -1];
      }
      if (!bVar3) break;
      pMan->pPerm[(int)pPerm] = pMan->pPerm[(int)pPerm + -1];
      pPerm._0_4_ = (int)pPerm + -1;
    }
    pMan->pPerm[(int)pPerm] = cVar1;
  }
  Abc_TgExpendSymmetry(pMan,local_38);
  Abc_TgImplementPerm(pMan,local_38);
  pMan->fPhased = 0;
  pMan->nGroups = 1;
  pMan->pGroup[0].nGVars = (char)iVar2;
  Vec_IntClear(pMan->vPhase);
  return;
}

Assistant:

static void Abc_TgResetGroup(Abc_TgMan_t * pMan)
{
    int i, j;
    char * pPerm = pMan->pPerm;
    char pPermNew[16];
    int nGVars = pMan->nGVars;
    for (i = 1; i < nGVars; i++)
    {
        char t = pPerm[i];
        for (j = i; j > 0 && pPerm[j - 1] > t; j--)
            pPerm[j] = pPerm[j - 1];
        pPerm[j] = t;
    }
    Abc_TgExpendSymmetry(pMan, pPermNew);
    Abc_TgImplementPerm(pMan, pPermNew);
    pMan->fPhased = 0;
    pMan->nGroups = 1;
    pMan->pGroup->nGVars = nGVars;
    Vec_IntClear(pMan->vPhase);
}